

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O3

void __thiscall
deqp::gls::LongStressCaseInternal::Texture::setSubData
          (Texture *this,ConstPixelBufferAccess *src,int xOff,int yOff,int width,int height)

{
  uint uVar1;
  TransferFormat TVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  uint param;
  GLsizei GVar7;
  GLsizei GVar8;
  
  TVar2 = glu::getTransferFormat(src->m_format);
  uVar1 = tcu::TextureFormat::getPixelSize(&src->m_format);
  uVar4 = 8;
  if ((int)uVar1 < 8) {
    uVar4 = uVar1;
  }
  param = 1;
  if ((uVar1 & uVar1 - 1) == 0) {
    param = uVar4;
  }
  glwPixelStorei(0xcf5,param);
  if (this->m_type == TEXTURETYPE_CUBE) {
    glwBindTexture(0x8513,this->m_textureGL);
    if (0 < this->m_numMipLevels) {
      iVar6 = 0;
      do {
        bVar3 = (byte)iVar6;
        GVar7 = width >> (bVar3 & 0x1f);
        if (GVar7 < 2) {
          GVar7 = 1;
        }
        GVar8 = height >> (bVar3 & 0x1f);
        if (GVar8 < 2) {
          GVar8 = 1;
        }
        lVar5 = 0;
        do {
          glwTexSubImage2D(*(GLenum *)((long)&DAT_00667f3c + lVar5),iVar6,xOff >> (bVar3 & 0x1f),
                           yOff >> (bVar3 & 0x1f),GVar7,GVar8,TVar2.format,TVar2.dataType,
                           src->m_data);
          lVar5 = lVar5 + 4;
        } while ((int)lVar5 != 0x18);
        iVar6 = iVar6 + 1;
      } while (iVar6 < this->m_numMipLevels);
    }
  }
  else if ((this->m_type == TEXTURETYPE_2D) &&
          (glwBindTexture(0xde1,this->m_textureGL), 0 < this->m_numMipLevels)) {
    iVar6 = 0;
    do {
      bVar3 = (byte)iVar6;
      GVar7 = width >> (bVar3 & 0x1f);
      if (GVar7 < 2) {
        GVar7 = 1;
      }
      GVar8 = height >> (bVar3 & 0x1f);
      if (GVar8 < 2) {
        GVar8 = 1;
      }
      glwTexSubImage2D(0xde1,iVar6,xOff >> (bVar3 & 0x1f),yOff >> (bVar3 & 0x1f),GVar7,GVar8,
                       TVar2.format,TVar2.dataType,src->m_data);
      iVar6 = iVar6 + 1;
    } while (iVar6 < this->m_numMipLevels);
  }
  return;
}

Assistant:

void Texture::setSubData (const ConstPixelBufferAccess& src, const int xOff, const int yOff, const int width, const int height) const
{
	const TextureFormat&		format		= src.getFormat();
	const glu::TransferFormat	transfer	= glu::getTransferFormat(format);

	DE_ASSERT(src.getRowPitch() == format.getPixelSize()*src.getWidth());
	DE_ASSERT(isMatchingGLInternalFormat(m_internalFormat, format));
	DE_ASSERT(width <= src.getWidth() && height <= src.getHeight());

	glPixelStorei(GL_UNPACK_ALIGNMENT, computePixelStore(format));

	if (m_type == TEXTURETYPE_2D)
	{
		glBindTexture(GL_TEXTURE_2D, m_textureGL);
		for (int level = 0; level < m_numMipLevels; level++)
			glTexSubImage2D(GL_TEXTURE_2D, level, xOff>>level, yOff>>level, de::max(1, width>>level), de::max(1, height>>level), transfer.format, transfer.dataType, src.getDataPtr());
	}
	else if (m_type == TEXTURETYPE_CUBE)
	{
		glBindTexture(GL_TEXTURE_CUBE_MAP, m_textureGL);
		for (int level = 0; level < m_numMipLevels; level++)
		{
			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				glTexSubImage2D(cubeFaceToGLFace((CubeFace)face), level, xOff>>level, yOff>>level, de::max(1, width>>level), de::max(1, height>>level), transfer.format, transfer.dataType, src.getDataPtr());
		}
	}
	else
		DE_ASSERT(false);
}